

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

bool __thiscall
Js::ByteCodeWriter::DoDynamicProfileOpcode(ByteCodeWriter *this,Phase tag,bool noHeuristics)

{
  FunctionBody *pFVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  FunctionInfo *pFVar7;
  
  bVar3 = DynamicProfileInfo::IsEnabled(tag,this->m_functionWrite);
  if (bVar3) {
    bVar3 = true;
    if (tag != InlinePhase) {
      return true;
    }
    uVar5 = FunctionProxy::GetSourceContextId((FunctionProxy *)this->m_functionWrite);
    pFVar1 = this->m_functionWrite;
    pFVar7 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar7 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar4) goto LAB_0088c82d;
      *puVar6 = 0;
      pFVar7 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar4 = Phases::IsEnabled((Phases *)&DAT_01599240,InlinePhase,uVar5,pFVar7->functionId);
    if (((!bVar4 && !noHeuristics) && (this->m_hasLoop == true)) && (this->m_loopNest == 0)) {
      uVar5 = FunctionProxy::GetSourceContextId((FunctionProxy *)this->m_functionWrite);
      pFVar1 = this->m_functionWrite;
      pFVar7 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      if (pFVar7 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar3) {
LAB_0088c82d:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
        pFVar7 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      bVar3 = Phases::IsEnabled((Phases *)&DAT_015a4e90,InlineOutsideLoopsPhase,uVar5,
                                pFVar7->functionId);
      bVar3 = !bVar3;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ByteCodeWriter::DoDynamicProfileOpcode(Phase tag, bool noHeuristics) const
    {
#if ENABLE_PROFILE_INFO
        if (!DynamicProfileInfo::IsEnabled(tag, this->m_functionWrite))
        {
            return false;
        }

        // Other heuristics
        switch (tag)
        {
        case Phase::InlinePhase:
            // Do profile opcode everywhere if we are an inline candidate
            // Otherwise, only in loops if the function has loop
#pragma prefast(suppress:6236, "DevDiv bug 830883. False positive when PHASE_OFF is #defined as '(false)'.")
            return PHASE_FORCE(Phase::InlinePhase, this->m_functionWrite) ||
                ((noHeuristics || !this->m_hasLoop || (this->m_loopNest != 0) ||
                        !(PHASE_OFF(InlineOutsideLoopsPhase, this->m_functionWrite))));

        default:
            return true;
        }
#else
        return false;
#endif
    }